

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCCurve.cpp
# Opt level: O2

size_t __thiscall
Assimp::IFC::anon_unknown_9::Conic::EstimateSampleCount(Conic *this,IfcFloat a,IfcFloat b)

{
  float fVar1;
  uint __line;
  bool bVar2;
  ulong uVar3;
  char *__assertion;
  double dVar4;
  double dVar5;
  
  bVar2 = Curve::InRange(&this->super_Curve,a);
  if (bVar2) {
    bVar2 = Curve::InRange(&this->super_Curve,b);
    if (bVar2) {
      dVar5 = ((this->super_Curve).conv)->angle_scale;
      dVar4 = fmod(a * dVar5,6.283185307179586);
      dVar5 = fmod(b * dVar5,6.283185307179586);
      fVar1 = ((this->super_Curve).conv)->settings->conicSamplingAngle;
      dVar5 = ceil(ABS(dVar5 - dVar4));
      dVar5 = dVar5 / (((double)fVar1 * 3.141592653589793) / 180.0);
      uVar3 = (ulong)dVar5;
      return (long)(dVar5 - 9.223372036854776e+18) & (long)uVar3 >> 0x3f | uVar3;
    }
    __assertion = "InRange( b )";
    __line = 0x51;
  }
  else {
    __assertion = "InRange( a )";
    __line = 0x50;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Importer/IFC/IFCCurve.cpp"
                ,__line,
                "virtual size_t Assimp::IFC::(anonymous namespace)::Conic::EstimateSampleCount(IfcFloat, IfcFloat) const"
               );
}

Assistant:

size_t EstimateSampleCount(IfcFloat a, IfcFloat b) const {
        ai_assert( InRange( a ) );
        ai_assert( InRange( b ) );

        a *= conv.angle_scale;
        b *= conv.angle_scale;

        a = std::fmod(a,static_cast<IfcFloat>( AI_MATH_TWO_PI ));
        b = std::fmod(b,static_cast<IfcFloat>( AI_MATH_TWO_PI ));
        const IfcFloat setting = static_cast<IfcFloat>( AI_MATH_PI * conv.settings.conicSamplingAngle / 180.0 );
        return static_cast<size_t>( std::ceil(std::abs( b-a)) / setting);
    }